

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SelectDefaultSearchModes(cmFindCommon *this)

{
  bool bVar1;
  const_iterator pvVar2;
  cmValue local_140;
  cmValue def;
  value_type *path;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  *__range1;
  undefined1 local_100 [8];
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  search_paths;
  cmFindCommon *this_local;
  
  search_paths._M_elems[5].second.field_2._8_8_ = this;
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_100,&this->NoPackageRootPath,(char (*) [33])"CMAKE_FIND_USE_PACKAGE_ROOT_PATH"
            );
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[26],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&search_paths._M_elems[0].second.field_2 + 8),&this->NoCMakePath,
             (char (*) [26])"CMAKE_FIND_USE_CMAKE_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[38],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&search_paths._M_elems[1].second.field_2 + 8),&this->NoCMakeEnvironmentPath,
             (char (*) [38])"CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[39],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&search_paths._M_elems[2].second.field_2 + 8),&this->NoSystemEnvironmentPath,
             (char (*) [39])"CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&search_paths._M_elems[3].second.field_2 + 8),&this->NoCMakeSystemPath,
             (char (*) [33])"CMAKE_FIND_USE_CMAKE_SYSTEM_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[30],_true>
            ((pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&search_paths._M_elems[4].second.field_2 + 8),&this->NoCMakeInstallPath,
             (char (*) [30])"CMAKE_FIND_USE_INSTALL_PREFIX");
  __end1 = std::
           array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
           ::begin((array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
                    *)local_100);
  pvVar2 = std::
           array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
           ::end((array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
                  *)local_100);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    def.Value = (string *)__end1;
    local_140 = cmMakefile::GetDefinition(this->Makefile,&__end1->second);
    bVar1 = cmValue::operator_cast_to_bool(&local_140);
    if (bVar1) {
      bVar1 = cmValue::IsOn(&local_140);
      **(byte **)def.Value = (bVar1 ^ 0xffU) & 1;
    }
  }
  std::
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  ::~array((array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
            *)local_100);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultSearchModes()
{
  const std::array<std::pair<bool&, std::string>, 6> search_paths = {
    { { this->NoPackageRootPath, "CMAKE_FIND_USE_PACKAGE_ROOT_PATH" },
      { this->NoCMakePath, "CMAKE_FIND_USE_CMAKE_PATH" },
      { this->NoCMakeEnvironmentPath,
        "CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH" },
      { this->NoSystemEnvironmentPath,
        "CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH" },
      { this->NoCMakeSystemPath, "CMAKE_FIND_USE_CMAKE_SYSTEM_PATH" },
      { this->NoCMakeInstallPath, "CMAKE_FIND_USE_INSTALL_PREFIX" } }
  };

  for (auto const& path : search_paths) {
    cmValue def = this->Makefile->GetDefinition(path.second);
    if (def) {
      path.first = !def.IsOn();
    }
  }
}